

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

XProtoType * __thiscall xercesc_4_0::XMLUri::getProtoType(XMLUri *this)

{
  return (XProtoType *)classXMLUri;
}

Assistant:

void XMLUri::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng<<fPort;
        serEng.writeString(fScheme);
        serEng.writeString(fUserInfo);
        serEng.writeString(fHost);
        serEng.writeString(fRegAuth);
        serEng.writeString(fPath);
        serEng.writeString(fQueryString);
        serEng.writeString(fFragment);
        serEng.writeString(fURIText);
    }
    else
    {
        serEng>>fPort;
        serEng.readString(fScheme);
        serEng.readString(fUserInfo);
        serEng.readString(fHost);
        serEng.readString(fRegAuth);
        serEng.readString(fPath);
        serEng.readString(fQueryString);
        serEng.readString(fFragment);
        serEng.readString(fURIText);
    }

}